

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::StringStreams::release(StringStreams *this,size_t index)

{
  reference this_00;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type in_RSI;
  vector<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  
  this_00 = std::
            vector<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](in_RDI,in_RSI);
  pbVar1 = Detail::
           unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator->(this_00);
  std::ios::copyfmt((ios *)(pbVar1 + *(long *)(*(long *)pbVar1 + -0x18)));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (unaff_retaddr,(value_type_conflict1 *)in_RDI);
  return;
}

Assistant:

void release( std::size_t index ) {
            m_streams[index]->copyfmt( m_referenceStream ); // Restore initial flags and other state
            m_unused.push_back(index);
        }